

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx2.cpp
# Opt level: O3

int __thiscall
ncnn::Crop_x86_avx2::forward(Crop_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined1 uVar13;
  undefined1 uVar15;
  undefined8 uVar16;
  Option *opt_00;
  int iVar23;
  long lVar24;
  ulong uVar25;
  sbyte sVar26;
  long lVar27;
  ulong uVar28;
  void *__ptr;
  Allocator *pAVar29;
  int iVar30;
  uint uVar31;
  int iVar32;
  size_t sVar33;
  int iVar34;
  uint uVar35;
  bool bVar36;
  int _outw;
  int _outh;
  int _woffset;
  Mat local_158;
  int _outc;
  int _outd;
  int _hoffset;
  size_t local_f8;
  Option *local_f0;
  int _coffset;
  int local_e4;
  ulong local_e0;
  Mat m;
  int _doffset;
  Mat m_1;
  undefined4 uVar10;
  undefined3 uVar12;
  undefined2 uVar14;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined3 uVar19;
  undefined1 uVar20;
  undefined2 uVar21;
  undefined1 uVar22;
  
  iVar23 = bottom_blob->w;
  lVar24 = (long)iVar23;
  iVar30 = bottom_blob->h;
  lVar27 = (long)iVar30;
  local_e4 = bottom_blob->d;
  local_158.c = bottom_blob->c;
  local_e0 = (ulong)(uint)local_158.c;
  iVar32 = bottom_blob->elempack;
  local_158.w = iVar23;
  local_158.h = iVar30;
  local_158.d = local_e4;
  local_f0 = opt;
  if (iVar32 != 4) {
    if (iVar32 != 8) goto switchD_001bc4eb_default;
    iVar34 = bottom_blob->dims + -1;
    switch(iVar34) {
    case 0:
      local_158.cstep = lVar24 << 3;
      local_158.dims = 1;
      local_158.w = (int)local_158.cstep;
      local_158.h = 1;
      local_158.d = 1;
      local_158.c = 1;
      goto LAB_001bc26b;
    case 1:
      local_158.elemsize._0_4_ = 4;
      local_158.elempack = 1;
      local_158.dims = 2;
      local_158.h = (int)(lVar27 * 8);
      local_158.d = 1;
      local_158.c = 1;
      local_158.cstep = lVar27 * 8 * lVar24;
      break;
    case 2:
      local_158.dims = 3;
      local_158.d = 1;
      lVar27 = lVar27 * lVar24;
      goto LAB_001bc25a;
    case 3:
      local_158.dims = 4;
      lVar27 = lVar27 * lVar24 * (long)local_e4;
LAB_001bc25a:
      local_158.c = local_158.c * 8;
      local_158.cstep = lVar27 + 3U & 0x3ffffffffffffffc;
LAB_001bc26b:
      local_158.elemsize._0_4_ = 4;
      local_158.elempack = 1;
      break;
    default:
      local_158.cstep = 0;
      local_158.elemsize._0_4_ = 0;
      local_158.elempack = 0;
      local_158.dims = 0;
      local_158.w = 0;
      local_158.h = 0;
      local_158.d = 0;
      local_158.c = 0;
    }
    local_158.elemsize._4_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.refcount._0_4_ = 0;
    local_158.allocator = (Allocator *)0x0;
    local_158.data = (void *)0x0;
    local_f8 = bottom_blob->elemsize;
    Crop::resolve_crop_roi
              ((Crop *)((long)&this->_vptr_Crop_x86_avx2 + (long)this->_vptr_Crop_x86_avx2[-3]),
               &local_158,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,&_outc);
    piVar1 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    switch(iVar34) {
    case 0:
      uVar35 = _outw & 7;
      bVar36 = (_outw & 3U) == 0;
      iVar30 = 8;
      if (uVar35 != 0) {
        iVar30 = (uint)bVar36 * 3 + 1;
      }
      sVar26 = 3;
      if (uVar35 != 0) {
        sVar26 = bVar36 * '\x02';
      }
      uVar25 = (long)_outw % (long)iVar30;
      if (iVar23 != _outw / iVar30 || uVar35 != 0) {
        if (((_outw | _woffset) & 7U) == 0) {
          Mat::create(top_blob,_outw / iVar30,(local_f8 >> 3) << sVar26,8,local_f0->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            iVar23 = _woffset + 7;
            if (-1 < _woffset) {
              iVar23 = _woffset;
            }
            crop_pack8_avx(bottom_blob,top_blob,0,iVar23 >> 3);
            return 0;
          }
          return -100;
        }
        break;
      }
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar1 = bottom_blob->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = top_blob->refcount;
      if (piVar1 == (int *)0x0) goto LAB_001bda96;
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 != 0) goto LAB_001bda96;
      __ptr = top_blob->data;
      pAVar29 = top_blob->allocator;
      if (pAVar29 != (Allocator *)0x0) goto LAB_001bcca4;
      if (__ptr == (void *)0x0) goto LAB_001bda96;
      goto LAB_001bda8e;
    case 1:
      sVar26 = 3;
      if ((_outh & 7U) != 0) {
        sVar26 = ((_outh & 3U) == 0) * '\x02';
      }
      if (_outw != iVar23) {
LAB_001bc90d:
        if (((_hoffset | _outh) & 7U) == 0) {
          iVar23 = _outh + 7;
          if (-1 < _outh) {
            iVar23 = _outh;
          }
          Mat::create(top_blob,_outw,iVar23 >> 3,(local_f8 >> 3) << sVar26,8,
                      local_f0->blob_allocator);
          if (top_blob->data != (void *)0x0) {
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar23 = _hoffset + 7;
              if (-1 < _hoffset) {
                iVar23 = _hoffset;
              }
              crop_pack8_avx(bottom_blob,top_blob,iVar23 >> 3,_woffset);
              return 0;
            }
            return -100;
          }
          return -100;
        }
        break;
      }
      iVar23 = 8;
      if ((_outh & 7U) != 0) {
        iVar23 = (uint)((_outh & 3U) == 0) * 3 + 1;
      }
      uVar25 = (long)_outh % (long)iVar23;
      if (((_outh & 7U) != 0) || (_outh / iVar23 != iVar30)) goto LAB_001bc90d;
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar1 = bottom_blob->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = top_blob->refcount;
      if (piVar1 == (int *)0x0) goto LAB_001bda96;
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 != 0) goto LAB_001bda96;
      __ptr = top_blob->data;
      pAVar29 = top_blob->allocator;
      goto joined_r0x001bc74d;
    case 2:
      sVar26 = 3;
      if ((_outc & 7U) != 0) {
        sVar26 = ((_outc & 3U) == 0) * '\x02';
      }
      local_f8 = (local_f8 >> 3) << sVar26;
      if (iVar30 == _outh && iVar23 == _outw) {
        iVar34 = 8;
        if ((_outc & 7U) != 0) {
          iVar34 = (uint)((_outc & 3U) == 0) * 3 + 1;
        }
        uVar25 = (long)_outc % (long)iVar34;
        if (((_outc & 7U) == 0) && (_outc / iVar34 == (int)local_e0)) {
          if (top_blob == bottom_blob) {
            return 0;
          }
          piVar1 = bottom_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          piVar1 = top_blob->refcount;
          if (piVar1 == (int *)0x0) goto LAB_001bda96;
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 != 0) goto LAB_001bda96;
          __ptr = top_blob->data;
          pAVar29 = top_blob->allocator;
          goto joined_r0x001bc74d;
        }
      }
      if (((_coffset | _outc) & 7U) != 0) break;
      iVar32 = _coffset + 7;
      if (-1 < _coffset) {
        iVar32 = _coffset;
      }
      iVar34 = _outc + 7;
      if (-1 < _outc) {
        iVar34 = _outc;
      }
      uVar35 = iVar34 >> 3;
      local_158.w = bottom_blob->w;
      local_158.h = bottom_blob->h;
      if (bottom_blob->dims == 3) {
        sVar33 = bottom_blob->elemsize;
        local_158.data =
             (void *)((long)(iVar32 >> 3) * bottom_blob->cstep * sVar33 + (long)bottom_blob->data);
        lVar24 = (long)local_158.h * (long)local_158.w * sVar33;
        local_158.d = 1;
        local_158.dims = 3;
      }
      else {
        local_158.d = bottom_blob->d;
        sVar33 = bottom_blob->elemsize;
        local_158.data =
             (void *)((long)(iVar32 >> 3) * bottom_blob->cstep * sVar33 + (long)bottom_blob->data);
        lVar24 = (long)local_158.h * (long)local_158.w * (long)local_158.d * sVar33;
        local_158.dims = 4;
      }
      local_158.allocator = bottom_blob->allocator;
      local_158.elempack = bottom_blob->elempack;
      local_158.refcount._0_4_ = 0;
      local_158.refcount._4_4_ = 0;
      local_158.elemsize._0_4_ = (undefined4)sVar33;
      local_158.elemsize._4_4_ = (undefined4)(sVar33 >> 0x20);
      local_158.cstep = (lVar24 + 0xfU & 0xfffffffffffffff0) / sVar33;
      local_158.c = uVar35;
      if (iVar30 != _outh || iVar23 != _outw) {
LAB_001bdbf8:
        Mat::create(top_blob,_outw,_outh,uVar35,local_f8,8,local_f0->blob_allocator);
        iVar23 = -100;
        if ((top_blob->data != (void *)0x0) && (top_blob->cstep * (long)top_blob->c != 0)) {
          if (top_blob->c < 1) {
            iVar23 = 0;
          }
          else {
            lVar24 = 0;
            do {
              m.c = 1;
              if (local_158.dims != 3) {
                m.c = local_158.d;
              }
              m.elemsize = CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
              m.data = (void *)(local_158.cstep * lVar24 * m.elemsize + (long)local_158.data);
              iVar23 = 0;
              m.refcount = (int *)0x0;
              m.elempack = local_158.elempack;
              m.allocator = local_158.allocator;
              m._40_8_ = CONCAT44(local_158.w,(uint)(local_158.dims == 3)) ^ 3;
              m.h = local_158.h;
              m.cstep = (long)local_158.h * (long)local_158.w;
              m.d = 1;
              bVar36 = top_blob->dims == 3;
              m_1.c = 1;
              if (!bVar36) {
                m_1.c = top_blob->d;
              }
              m_1.w = top_blob->w;
              m_1.h = top_blob->h;
              m_1.dims = bVar36 ^ 3;
              m_1.elemsize = top_blob->elemsize;
              m_1.data = (void *)(top_blob->cstep * lVar24 * m_1.elemsize + (long)top_blob->data);
              m_1.elempack = top_blob->elempack;
              m_1.allocator = top_blob->allocator;
              m_1.refcount = (int *)0x0;
              m_1.cstep = (long)m_1.h * (long)m_1.w;
              m_1.d = 1;
              crop_pack8_avx(&m,&m_1,_hoffset,_woffset);
              lVar24 = lVar24 + 1;
            } while (lVar24 < top_blob->c);
          }
        }
      }
      else {
        Mat::clone(&m,(__fn *)&local_158,(void *)0x0,uVar35,(void *)(ulong)(uint)_outh);
        if (&m != top_blob) {
          if (m.refcount != (int *)0x0) {
            LOCK();
            *m.refcount = *m.refcount + 1;
            UNLOCK();
          }
          piVar1 = top_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = m.data;
          top_blob->refcount = m.refcount;
          top_blob->elemsize = m.elemsize;
          top_blob->elempack = m.elempack;
          top_blob->allocator = m.allocator;
          top_blob->dims = m.dims;
          top_blob->w = m.w;
          top_blob->h = m.h;
          top_blob->d = m.d;
          top_blob->c = m.c;
          top_blob->cstep = m.cstep;
        }
        if (m.refcount != (int *)0x0) {
          LOCK();
          *m.refcount = *m.refcount + -1;
          UNLOCK();
          if (*m.refcount == 0) {
            if (m.allocator == (Allocator *)0x0) {
              if (m.data != (void *)0x0) {
                free(m.data);
              }
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar23 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          iVar23 = _outc + 7;
          if (-1 < _outc) {
            iVar23 = _outc;
          }
          uVar35 = iVar23 >> 3;
          goto LAB_001bdbf8;
        }
      }
      piVar1 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      if (piVar1 == (int *)0x0) {
        return iVar23;
      }
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 != 0) {
        return iVar23;
      }
      if (local_158.allocator != (Allocator *)0x0) {
        (*(local_158.allocator)->_vptr_Allocator[3])();
        return iVar23;
      }
      goto joined_r0x001bda82;
    case 3:
      sVar26 = 3;
      if ((_outc & 7U) != 0) {
        sVar26 = ((_outc & 3U) == 0) * '\x02';
      }
      local_f8 = (local_f8 >> 3) << sVar26;
      if (local_e4 == _outd && (iVar30 == _outh && iVar23 == _outw)) {
        iVar34 = 8;
        if ((_outc & 7U) != 0) {
          iVar34 = (uint)((_outc & 3U) == 0) * 3 + 1;
        }
        uVar25 = (long)_outc % (long)iVar34;
        if (((_outc & 7U) == 0) && (_outc / iVar34 == (int)local_e0)) {
          if (top_blob == bottom_blob) {
            return 0;
          }
          piVar1 = bottom_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          piVar1 = top_blob->refcount;
          if (piVar1 == (int *)0x0) goto LAB_001bda96;
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 != 0) goto LAB_001bda96;
          __ptr = top_blob->data;
          pAVar29 = top_blob->allocator;
          goto joined_r0x001bc74d;
        }
      }
      if (((_coffset | _outc) & 7U) == 0) {
        iVar32 = _coffset + 7;
        if (-1 < _coffset) {
          iVar32 = _coffset;
        }
        iVar34 = _outc + 7;
        if (-1 < _outc) {
          iVar34 = _outc;
        }
        uVar35 = iVar34 >> 3;
        local_158.w = bottom_blob->w;
        local_158.h = bottom_blob->h;
        if (bottom_blob->dims == 3) {
          sVar33 = bottom_blob->elemsize;
          local_158.data =
               (void *)((long)(iVar32 >> 3) * bottom_blob->cstep * sVar33 + (long)bottom_blob->data)
          ;
          lVar24 = (long)local_158.h * (long)local_158.w * sVar33;
          local_158.d = 1;
          local_158.dims = 3;
        }
        else {
          local_158.d = bottom_blob->d;
          sVar33 = bottom_blob->elemsize;
          local_158.data =
               (void *)((long)(iVar32 >> 3) * bottom_blob->cstep * sVar33 + (long)bottom_blob->data)
          ;
          lVar24 = (long)local_158.h * (long)local_158.w * (long)local_158.d * sVar33;
          local_158.dims = 4;
        }
        local_158.allocator = bottom_blob->allocator;
        local_158.elempack = bottom_blob->elempack;
        local_158.refcount._0_4_ = 0;
        local_158.refcount._4_4_ = 0;
        local_158.elemsize._0_4_ = (undefined4)sVar33;
        local_158.elemsize._4_4_ = (undefined4)(sVar33 >> 0x20);
        local_158.cstep = (lVar24 + 0xfU & 0xfffffffffffffff0) / sVar33;
        local_158.c = uVar35;
        if (local_e4 != _outd || (iVar30 != _outh || iVar23 != _outw)) {
LAB_001bd808:
          Mat::create(top_blob,_outw,_outh,_outd,uVar35,local_f8,8,local_f0->blob_allocator);
          iVar23 = -100;
          if (top_blob->data != (void *)0x0) {
            uVar25 = (ulong)top_blob->c;
            if (top_blob->cstep * uVar25 != 0) {
              if (0 < top_blob->c) {
                uVar28 = (ulong)(uint)_outd;
                lVar24 = 0;
                do {
                  if (0 < (int)uVar28) {
                    lVar27 = 0;
                    do {
                      m.elemsize = CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize)
                      ;
                      m.cstep = (long)local_158.h * (long)local_158.w;
                      m.data = (void *)((long)local_158.data +
                                       (long)(_doffset + (int)lVar27) * m.elemsize * m.cstep +
                                       local_158.cstep * lVar24 * m.elemsize);
                      m.refcount = (int *)0x0;
                      m.elempack = local_158.elempack;
                      m.allocator = local_158.allocator;
                      m.w = local_158.w;
                      m.dims = 2;
                      m.h = local_158.h;
                      m.d = 1;
                      m.c = 1;
                      m_1.w = top_blob->w;
                      m_1.h = top_blob->h;
                      m_1.elemsize = top_blob->elemsize;
                      m_1.elempack = top_blob->elempack;
                      m_1.allocator = top_blob->allocator;
                      m_1.cstep = (long)m_1.h * (long)m_1.w;
                      m_1.data = (void *)((long)top_blob->data +
                                         lVar27 * m_1.elemsize * m_1.cstep +
                                         top_blob->cstep * lVar24 * m_1.elemsize);
                      m_1.refcount = (int *)0x0;
                      m_1.dims = 2;
                      m_1.d = 1;
                      m_1.c = 1;
                      crop_pack8_avx(&m,&m_1,_hoffset,_woffset);
                      uVar28 = (ulong)_outd;
                      lVar27 = lVar27 + 1;
                    } while (lVar27 < (long)uVar28);
                    uVar25 = (ulong)(uint)top_blob->c;
                  }
                  lVar24 = lVar24 + 1;
                } while (lVar24 < (int)uVar25);
              }
              iVar23 = 0;
            }
          }
        }
        else {
          Mat::clone(&m,(__fn *)&local_158,(void *)0x0,_outd,(void *)(ulong)uVar35);
          Mat::operator=(top_blob,&m);
          Mat::~Mat(&m);
          iVar23 = -100;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            iVar23 = _outc + 7;
            if (-1 < _outc) {
              iVar23 = _outc;
            }
            uVar35 = iVar23 >> 3;
            goto LAB_001bd808;
          }
        }
        piVar1 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
        if (piVar1 == (int *)0x0) {
          return iVar23;
        }
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 != 0) {
          return iVar23;
        }
        if (local_158.allocator != (Allocator *)0x0) {
          (*(local_158.allocator)->_vptr_Allocator[3])();
          return iVar23;
        }
        goto joined_r0x001bda82;
      }
    }
    goto switchD_001bc4eb_default;
  }
  uVar35 = bottom_blob->dims - 1;
  switch(uVar35) {
  case 0:
    local_158.cstep = lVar24 << 2;
    local_158.dims = 1;
    local_158.w = (int)local_158.cstep;
    local_158.h = 1;
    local_158.d = 1;
    local_158.c = 1;
    goto LAB_001bc32f;
  case 1:
    local_158.elemsize._0_4_ = 4;
    local_158.elempack = 1;
    local_158.dims = 2;
    local_158.h = (int)(lVar27 * 4);
    local_158.d = 1;
    local_158.c = 1;
    local_158.cstep = lVar27 * 4 * lVar24;
    break;
  case 2:
    local_158.dims = 3;
    local_158.d = 1;
    lVar27 = lVar27 * lVar24;
    goto LAB_001bc31e;
  case 3:
    local_158.dims = 4;
    lVar27 = lVar27 * lVar24 * (long)local_e4;
LAB_001bc31e:
    local_158.c = local_158.c * 4;
    local_158.cstep = lVar27 + 3U & 0x3ffffffffffffffc;
LAB_001bc32f:
    local_158.elemsize._0_4_ = 4;
    local_158.elempack = 1;
    break;
  default:
    local_158.cstep = 0;
    local_158.elemsize._0_4_ = 0;
    local_158.elempack = 0;
    local_158.dims = 0;
    local_158.w = 0;
    local_158.h = 0;
    local_158.d = 0;
    local_158.c = 0;
  }
  local_158.elemsize._4_4_ = 0;
  local_158.refcount._4_4_ = 0;
  local_158.refcount._0_4_ = 0;
  local_158.allocator = (Allocator *)0x0;
  local_158.data = (void *)0x0;
  local_f8 = bottom_blob->elemsize;
  Crop::resolve_crop_roi
            ((Crop *)((long)&this->_vptr_Crop_x86_avx2 + (long)this->_vptr_Crop_x86_avx2[-3]),
             &local_158,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,&_outc);
  piVar1 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        if (local_158.data != (void *)0x0) {
          free(local_158.data);
        }
      }
      else {
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (3 < uVar35) goto switchD_001bc4eb_default;
  iVar34 = _coffset >> 2;
  uVar31 = _outc >> 2;
  switch(uVar35) {
  case 0:
    uVar35 = _outw & 7;
    bVar36 = (_outw & 3U) == 0;
    iVar30 = 8;
    if (uVar35 != 0) {
      iVar30 = (uint)bVar36 * 3 + 1;
    }
    sVar26 = 3;
    if (uVar35 != 0) {
      sVar26 = bVar36 * '\x02';
    }
    uVar25 = (long)_outw % (long)iVar30;
    if (uVar35 == 4 && iVar23 == _outw / iVar30) {
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar1 = bottom_blob->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = top_blob->refcount;
      if (piVar1 == (int *)0x0) goto LAB_001bda96;
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 != 0) goto LAB_001bda96;
      __ptr = top_blob->data;
      pAVar29 = top_blob->allocator;
joined_r0x001bc74d:
      if (pAVar29 == (Allocator *)0x0) {
        if (__ptr != (void *)0x0) {
LAB_001bda8e:
          free(__ptr);
        }
      }
      else {
LAB_001bcca4:
        (*pAVar29->_vptr_Allocator[3])(pAVar29,__ptr,uVar25 & 0xffffffff);
      }
LAB_001bda96:
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar1 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar1;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar23 = bottom_blob->w;
      iVar30 = bottom_blob->h;
      iVar32 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar23;
      top_blob->h = iVar30;
      top_blob->d = iVar32;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    if ((uVar35 == 4) && ((_woffset & 3U) == 0)) {
      Mat::create(top_blob,_outw / iVar30,(local_f8 >> 2) << sVar26,4,local_f0->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep != 0) {
        iVar23 = _woffset + 3;
        if (-1 < _woffset) {
          iVar23 = _woffset;
        }
        crop_pack4_sse(bottom_blob,top_blob,0,iVar23 >> 2);
        return 0;
      }
      return -100;
    }
    break;
  case 1:
    uVar35 = _outh & 7;
    sVar26 = 3;
    if (uVar35 != 0) {
      sVar26 = ((_outh & 3U) == 0) * '\x02';
    }
    if (_outw == iVar23) {
      iVar23 = 8;
      if (uVar35 != 0) {
        iVar23 = (uint)((_outh & 3U) == 0) * 3 + 1;
      }
      uVar25 = (long)_outh % (long)iVar23;
      if ((uVar35 == 4) && (_outh / iVar23 == iVar30)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar1 = bottom_blob->refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = top_blob->refcount;
        if (piVar1 == (int *)0x0) goto LAB_001bda96;
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 != 0) goto LAB_001bda96;
        __ptr = top_blob->data;
        pAVar29 = top_blob->allocator;
        goto joined_r0x001bc74d;
      }
    }
    if ((uVar35 == 4) && ((_hoffset & 3U) == 0)) {
      Mat::create(top_blob,_outw,_outh >> 2,(local_f8 >> 2) << sVar26,4,local_f0->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep != 0) {
        iVar23 = _hoffset + 3;
        if (-1 < _hoffset) {
          iVar23 = _hoffset;
        }
        crop_pack4_sse(bottom_blob,top_blob,iVar23 >> 2,_woffset);
        return 0;
      }
      return -100;
    }
    break;
  case 2:
    uVar35 = _outc & 7;
    sVar26 = 3;
    if (uVar35 != 0) {
      sVar26 = ((_outc & 3U) == 0) * '\x02';
    }
    local_f8 = (local_f8 >> 2) << sVar26;
    bVar36 = iVar30 == _outh;
    bVar2 = iVar23 == _outw;
    if (bVar36 && bVar2) {
      iVar23 = 8;
      if (uVar35 != 0) {
        iVar23 = (uint)((_outc & 3U) == 0) * 3 + 1;
      }
      uVar25 = (long)_outc % (long)iVar23;
      if ((uVar35 == 4) && (_outc / iVar23 == (int)local_e0)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar1 = bottom_blob->refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = top_blob->refcount;
        if (piVar1 == (int *)0x0) goto LAB_001bda96;
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 != 0) goto LAB_001bda96;
        __ptr = top_blob->data;
        pAVar29 = top_blob->allocator;
        goto joined_r0x001bc74d;
      }
    }
    if (uVar35 != 4 || (_coffset & 3U) != 0) break;
    local_158.w = bottom_blob->w;
    local_158.h = bottom_blob->h;
    if (bottom_blob->dims == 3) {
      sVar33 = bottom_blob->elemsize;
      local_158.data =
           (void *)((long)iVar34 * bottom_blob->cstep * sVar33 + (long)bottom_blob->data);
      lVar24 = (long)local_158.h * (long)local_158.w * sVar33;
      local_158.d = 1;
      local_158.dims = 3;
    }
    else {
      local_158.d = bottom_blob->d;
      sVar33 = bottom_blob->elemsize;
      local_158.data =
           (void *)((long)iVar34 * bottom_blob->cstep * sVar33 + (long)bottom_blob->data);
      lVar24 = (long)local_158.h * (long)local_158.w * (long)local_158.d * sVar33;
      local_158.dims = 4;
    }
    local_158.allocator = bottom_blob->allocator;
    local_158.elempack = bottom_blob->elempack;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.elemsize._0_4_ = (undefined4)sVar33;
    local_158.elemsize._4_4_ = (undefined4)(sVar33 >> 0x20);
    local_158.cstep = (lVar24 + 0xfU & 0xfffffffffffffff0) / sVar33;
    local_158.c = uVar31;
    if (bVar36 && bVar2) {
      Mat::clone(&m,(__fn *)&local_158,(void *)0x0,(uint)(bVar36 && bVar2),
                 (void *)(ulong)(uint)_outh);
      Mat::operator=(top_blob,&m);
      Mat::~Mat(&m);
      iVar23 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
      goto LAB_001bd0fe;
    }
    else {
LAB_001bd0fe:
      iVar23 = _outc + 3;
      if (-1 < _outc) {
        iVar23 = _outc;
      }
      Mat::create(top_blob,_outw,_outh,iVar23 >> 2,local_f8,4,local_f0->blob_allocator);
      iVar23 = -100;
      if ((top_blob->data != (void *)0x0) && (top_blob->cstep * (long)top_blob->c != 0)) {
        if (top_blob->c < 1) {
          iVar23 = 0;
        }
        else {
          lVar24 = 0;
          do {
            m.c = 1;
            if (local_158.dims != 3) {
              m.c = local_158.d;
            }
            m.elemsize = CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
            m.data = (void *)(local_158.cstep * lVar24 * m.elemsize + (long)local_158.data);
            iVar23 = 0;
            m.refcount = (int *)0x0;
            m.elempack = local_158.elempack;
            m.allocator = local_158.allocator;
            m._40_8_ = CONCAT44(local_158.w,(uint)(local_158.dims == 3)) ^ 3;
            m.h = local_158.h;
            m.cstep = (long)local_158.h * (long)local_158.w;
            m.d = 1;
            bVar36 = top_blob->dims == 3;
            m_1.c = 1;
            if (!bVar36) {
              m_1.c = top_blob->d;
            }
            m_1.w = top_blob->w;
            m_1.h = top_blob->h;
            m_1.dims = bVar36 ^ 3;
            m_1.elemsize = top_blob->elemsize;
            m_1.data = (void *)(top_blob->cstep * lVar24 * m_1.elemsize + (long)top_blob->data);
            m_1.elempack = top_blob->elempack;
            m_1.allocator = top_blob->allocator;
            m_1.refcount = (int *)0x0;
            m_1.cstep = (long)m_1.h * (long)m_1.w;
            m_1.d = 1;
            crop_pack4_sse(&m,&m_1,_hoffset,_woffset);
            lVar24 = lVar24 + 1;
          } while (lVar24 < top_blob->c);
        }
      }
    }
    piVar1 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    if (piVar1 == (int *)0x0) {
      return iVar23;
    }
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) {
      return iVar23;
    }
    if (local_158.allocator != (Allocator *)0x0) {
      (*(local_158.allocator)->_vptr_Allocator[3])();
      return iVar23;
    }
joined_r0x001bda82:
    local_158.allocator = (Allocator *)0x0;
    if (local_158.data == (void *)0x0) {
      return iVar23;
    }
    goto LAB_001bd008;
  case 3:
    uVar35 = _outc & 7;
    sVar26 = 3;
    if (uVar35 != 0) {
      sVar26 = ((_outc & 3U) == 0) * '\x02';
    }
    local_f8 = (local_f8 >> 2) << sVar26;
    bVar36 = local_e4 == _outd;
    bVar2 = iVar30 == _outh;
    bVar3 = iVar23 == _outw;
    if (bVar36 && (bVar2 && bVar3)) {
      iVar23 = 8;
      if (uVar35 != 0) {
        iVar23 = (uint)((_outc & 3U) == 0) * 3 + 1;
      }
      if ((uVar35 == 4) && (_outc / iVar23 == (int)local_e0)) {
        Mat::operator=(top_blob,bottom_blob);
        return 0;
      }
    }
    if (uVar35 == 4 && (_coffset & 3U) == 0) {
      local_158.w = bottom_blob->w;
      local_158.h = bottom_blob->h;
      local_e4 = CONCAT31(local_e4._1_3_,bVar36 && (bVar2 && bVar3));
      if (bottom_blob->dims == 3) {
        sVar33 = bottom_blob->elemsize;
        local_158.data =
             (void *)((long)iVar34 * bottom_blob->cstep * sVar33 + (long)bottom_blob->data);
        lVar24 = (long)local_158.h * (long)local_158.w * sVar33;
        local_158.d = 1;
        local_158.dims = 3;
      }
      else {
        local_158.d = bottom_blob->d;
        sVar33 = bottom_blob->elemsize;
        local_158.data =
             (void *)((long)iVar34 * bottom_blob->cstep * sVar33 + (long)bottom_blob->data);
        lVar24 = (long)local_158.h * (long)local_158.w * (long)local_158.d * sVar33;
        local_158.dims = 4;
      }
      local_158.allocator = bottom_blob->allocator;
      local_158.elempack = bottom_blob->elempack;
      local_158.refcount._0_4_ = 0;
      local_158.refcount._4_4_ = 0;
      local_158.elemsize._0_4_ = (undefined4)sVar33;
      local_158.elemsize._4_4_ = (undefined4)(sVar33 >> 0x20);
      local_158.cstep = (lVar24 + 0xfU & 0xfffffffffffffff0) / sVar33;
      local_158.c = uVar31;
      if (bVar36 && (bVar2 && bVar3)) {
        Mat::clone(&m,(__fn *)&local_158,(void *)0x0,_outd,local_158.allocator);
        Mat::operator=(top_blob,&m);
        Mat::~Mat(&m);
        iVar23 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
        goto LAB_001bd3e4;
      }
      else {
LAB_001bd3e4:
        iVar23 = _outc + 3;
        if (-1 < _outc) {
          iVar23 = _outc;
        }
        Mat::create(top_blob,_outw,_outh,_outd,iVar23 >> 2,local_f8,4,local_f0->blob_allocator);
        iVar23 = -100;
        if (top_blob->data != (void *)0x0) {
          uVar25 = (ulong)top_blob->c;
          if (top_blob->cstep * uVar25 != 0) {
            if (0 < top_blob->c) {
              uVar28 = (ulong)(uint)_outd;
              lVar24 = 0;
              do {
                if (0 < (int)uVar28) {
                  lVar27 = 0;
                  do {
                    m.elemsize = CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
                    m.cstep = (long)local_158.h * (long)local_158.w;
                    m.data = (void *)((long)local_158.data +
                                     (long)(_doffset + (int)lVar27) * m.elemsize * m.cstep +
                                     local_158.cstep * lVar24 * m.elemsize);
                    m.refcount = (int *)0x0;
                    m.elempack = local_158.elempack;
                    m.allocator = local_158.allocator;
                    m.w = local_158.w;
                    m.dims = 2;
                    m.h = local_158.h;
                    m.d = 1;
                    m.c = 1;
                    m_1.w = top_blob->w;
                    m_1.h = top_blob->h;
                    m_1.elemsize = top_blob->elemsize;
                    m_1.elempack = top_blob->elempack;
                    m_1.allocator = top_blob->allocator;
                    m_1.cstep = (long)m_1.h * (long)m_1.w;
                    m_1.data = (void *)((long)top_blob->data +
                                       lVar27 * m_1.elemsize * m_1.cstep +
                                       top_blob->cstep * lVar24 * m_1.elemsize);
                    m_1.refcount = (int *)0x0;
                    m_1.dims = 2;
                    m_1.d = 1;
                    m_1.c = 1;
                    crop_pack4_sse(&m,&m_1,_hoffset,_woffset);
                    uVar28 = (ulong)_outd;
                    lVar27 = lVar27 + 1;
                  } while (lVar27 < (long)uVar28);
                  uVar25 = (ulong)(uint)top_blob->c;
                }
                lVar24 = lVar24 + 1;
              } while (lVar24 < (int)uVar25);
            }
            iVar23 = 0;
          }
        }
      }
      piVar1 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      if (piVar1 == (int *)0x0) {
        return iVar23;
      }
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 != 0) {
        return iVar23;
      }
      if (local_158.allocator != (Allocator *)0x0) {
        (*(local_158.allocator)->_vptr_Allocator[3])();
        return iVar23;
      }
      goto joined_r0x001bda82;
    }
  }
switchD_001bc4eb_default:
  opt_00 = local_f0;
  piVar1 = bottom_blob->refcount;
  local_158.data = bottom_blob->data;
  local_158.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_158.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_158.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
  local_158.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_158.elempack = bottom_blob->elempack;
  local_158.allocator = bottom_blob->allocator;
  uVar4 = bottom_blob->dims;
  uVar5 = bottom_blob->w;
  uVar6 = bottom_blob->h;
  uVar7 = bottom_blob->d;
  local_158.c = bottom_blob->c;
  local_158.cstep = bottom_blob->cstep;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  local_158.dims = uVar4;
  local_158.w = uVar5;
  local_158.h = uVar6;
  local_158.d = uVar7;
  if (iVar32 != 1) {
    m.data = *(void **)local_f0;
    m.elemsize = (size_t)local_f0->workspace_allocator;
    m.elempack = local_f0->openmp_blocktime;
    m._28_1_ = local_f0->use_winograd_convolution;
    m._29_1_ = local_f0->use_sgemm_convolution;
    m._30_1_ = local_f0->use_int8_inference;
    m._31_1_ = local_f0->use_vulkan_compute;
    m.allocator = *(Allocator **)&local_f0->use_bf16_storage;
    m._40_8_ = *(undefined8 *)&local_f0->use_shader_pack8;
    uVar8 = local_f0->flush_denormals;
    uVar9 = local_f0->use_local_pool_allocator;
    uVar11 = local_f0->use_reserved_1;
    uVar13 = local_f0->use_reserved_2;
    uVar15 = local_f0->use_reserved_3;
    uVar14 = CONCAT11(uVar15,uVar13);
    uVar12 = CONCAT21(uVar14,uVar11);
    uVar10 = CONCAT31(uVar12,uVar9);
    uVar16._0_1_ = local_f0->use_reserved_4;
    uVar16._1_1_ = local_f0->use_reserved_5;
    uVar16._2_1_ = local_f0->use_reserved_6;
    uVar16._3_1_ = local_f0->use_reserved_7;
    uVar17 = local_f0->use_reserved_8;
    uVar18 = local_f0->use_reserved_9;
    uVar20 = local_f0->use_reserved_10;
    uVar22 = local_f0->use_reserved_11;
    uVar21 = CONCAT11(uVar22,uVar20);
    uVar19 = CONCAT21(uVar21,uVar18);
    uVar16._4_4_ = CONCAT31(uVar19,uVar17);
    m.c = (int)uVar16;
    m.refcount = (int *)local_f0->workspace_allocator;
    m.h = uVar8;
    m.d = uVar10;
    m._60_4_ = uVar16._4_4_;
    convert_packing(bottom_blob,&local_158,1,(Option *)&m);
  }
  iVar23 = Crop::forward((Crop *)((long)&this->_vptr_Crop_x86_avx2 +
                                 (long)this->_vptr_Crop_x86_avx2[-3]),&local_158,top_blob,opt_00);
  piVar1 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        if (local_158.data != (void *)0x0) {
LAB_001bd008:
          free(local_158.data);
        }
      }
      else {
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar23;
}

Assistant:

int Crop_x86_avx2::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
#if __AVX__
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
#if __AVX__
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}